

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_url_decode(char *src,int src_len,char *dst,int dst_len,int is_form_url_encoded)

{
  int iVar1;
  ushort **ppuVar2;
  int local_4c;
  byte local_48;
  int local_40;
  int b;
  int a;
  int j;
  int i;
  int is_form_url_encoded_local;
  int dst_len_local;
  char *dst_local;
  int src_len_local;
  char *src_local;
  
  b = 0;
  for (a = 0; a < src_len && b < dst_len + -1; a = a + 1) {
    if ((((src[a] == '%') && (a < src_len + -2)) &&
        (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)src[(long)a + 1]] & 0x1000) != 0))
       && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)src[(long)a + 2]] & 0x1000) != 0)
       ) {
      local_40 = tolower((uint)(byte)src[(long)a + 1]);
      iVar1 = tolower((uint)(byte)src[(long)a + 2]);
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[local_40] & 0x800) == 0) {
        local_40 = local_40 + -0x57;
      }
      else {
        local_40 = local_40 + -0x30;
      }
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[iVar1] & 0x800) == 0) {
        local_48 = (char)iVar1 + 0xa9;
      }
      else {
        local_48 = (char)iVar1 - 0x30;
      }
      dst[b] = (byte)(local_40 << 4) | local_48;
      a = a + 2;
    }
    else if ((is_form_url_encoded == 0) || (src[a] != '+')) {
      dst[b] = src[a];
    }
    else {
      dst[b] = ' ';
    }
    b = b + 1;
  }
  dst[b] = '\0';
  if (a < src_len) {
    local_4c = -1;
  }
  else {
    local_4c = b;
  }
  return local_4c;
}

Assistant:

int mg_url_decode(const char *src, int src_len, char *dst,
                  int dst_len, int is_form_url_encoded) {
  int i, j, a, b;
#define HEXTOI(x) (isdigit(x) ? x - '0' : x - 'W')

  for (i = j = 0; i < src_len && j < dst_len - 1; i++, j++) {
    if (src[i] == '%' && i < src_len - 2 &&
        isxdigit(* (const unsigned char *) (src + i + 1)) &&
        isxdigit(* (const unsigned char *) (src + i + 2))) {
      a = tolower(* (const unsigned char *) (src + i + 1));
      b = tolower(* (const unsigned char *) (src + i + 2));
      dst[j] = (char) ((HEXTOI(a) << 4) | HEXTOI(b));
      i += 2;
    } else if (is_form_url_encoded && src[i] == '+') {
      dst[j] = ' ';
    } else {
      dst[j] = src[i];
    }
  }

  dst[j] = '\0'; // Null-terminate the destination

  return i >= src_len ? j : -1;
}